

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall Logger::~Logger(Logger *this)

{
  Buffer *logline;
  char **ppcVar1;
  char *pcVar2;
  size_t __n;
  pointer pcVar3;
  LogStream *pLVar4;
  char **ppcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  
  ppcVar5 = &(this->impl_).stream_.buffer_.cur_;
  pcVar2 = (this->impl_).stream_.buffer_.cur_;
  iVar7 = (int)ppcVar5;
  if (8 < iVar7 - (int)pcVar2) {
    builtin_strncpy(pcVar2," -- ",5);
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    *ppcVar5 = *ppcVar5 + 8;
  }
  pcVar2 = (this->impl_).stream_.buffer_.cur_;
  __n = (this->impl_).basename_._M_string_length;
  if ((int)__n < iVar7 - (int)pcVar2) {
    memcpy(pcVar2,(this->impl_).basename_._M_dataplus._M_p,__n);
    ppcVar1 = &(this->impl_).stream_.buffer_.cur_;
    *ppcVar1 = *ppcVar1 + __n;
  }
  pcVar2 = *ppcVar5;
  if (8 < iVar7 - (int)pcVar2) {
    pcVar2[0] = ':';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    *ppcVar5 = *ppcVar5 + 8;
  }
  pLVar4 = LogStream::operator<<((LogStream *)this,(this->impl_).line_);
  ppcVar5 = &(pLVar4->buffer_).cur_;
  pcVar2 = (pLVar4->buffer_).cur_;
  if (1 < (int)ppcVar5 - (int)pcVar2) {
    *pcVar2 = '\n';
    *ppcVar5 = *ppcVar5 + 1;
  }
  pcVar2 = (this->impl_).stream_.buffer_.cur_;
  pthread_once(&once_control_,once_init);
  logline = &(this->impl_).stream_.buffer_;
  AsyncLogging::append(AsyncLogger_,logline->data_,(int)pcVar2 - (int)logline);
  pcVar3 = (this->impl_).basename_._M_dataplus._M_p;
  paVar6 = &(this->impl_).basename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar6) {
    operator_delete(pcVar3,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Logger::~Logger(){
    impl_.stream_<<" -- "<<impl_.basename_<<":"<<impl_.line_<<'\n';
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}